

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O3

void helicsInputClearUpdate(HelicsInput inp)

{
  if ((inp != (HelicsInput)0x0) && (*inp == 0x3456e052)) {
    helics::Input::clearUpdate(*(Input **)((long)inp + 0x18));
  }
  return;
}

Assistant:

void helicsInputClearUpdate(HelicsInput inp)
{
    auto* inpObj = verifyInput(inp, nullptr);
    if (inpObj == nullptr) {
        return;
    }
    try {
        inpObj->inputPtr->clearUpdate();
    }
    // LCOV_EXCL_START
    catch (...) {
        ;
    }
    // LCOV_EXCL_STOP
}